

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

void bf_write_buffer(bfile_t *bfile)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = bfile->pos - bfile->ipos;
  uVar3 = 0;
  do {
    while( true ) {
      if (uVar2 <= uVar3) {
        bfile->ipos = bfile->ipos + uVar3;
        return;
      }
      sVar1 = fwrite(bfile->buffer + uVar3 + bfile->ipos % (ulong)bfile->buffer_size,1,uVar2 - uVar3
                     ,(FILE *)bfile->file);
      if (sVar1 != 0) break;
      fwrite("Error: fwrite() returned 0.\n",0x1c,1,_stderr);
    }
    uVar3 = uVar3 + sVar1;
  } while( true );
}

Assistant:

static
void
bf_write_buffer(
    bfile_t * bfile )
{
    size_t written, towrite;

    assert( bfile != NULL );
    assert( bfile->file != NULL );
    assert( (bfile->flags & BF_WRITABLE) != FALSE );

    towrite = bfile->pos - bfile->ipos;
    written = 0;
    while ( written < towrite ) {
        size_t res, bufpos;
        bufpos = bfile->ipos % bfile->buffer_size;
        res = fwrite( bfile->buffer + bufpos + written, 1, 
                      towrite - written, bfile->file );
        if ( res != 0 ) {
            written += res;
        } else {
            fprintf( stderr, "Error: fwrite() returned 0.\n" );
        }
    }

    bfile->ipos += written;
}